

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

vector<boost::any,_std::allocator<boost::any>_> *
trial::dynamic::convert::
overloader<std::vector<boost::any,_std::allocator<boost::any>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
::into(vector<boost::any,_std::allocator<boost::any>_> *__return_storage_ptr__,variable_type *input,
      error_code *error)

{
  int iVar1;
  bool bVar2;
  const_reference u;
  vector<boost::any,_std::allocator<boost::any>_> result;
  any value;
  const_iterator __end0;
  const_iterator __begin0;
  vector<boost::any,_std::allocator<boost::any>_> local_88;
  long *local_68;
  const_iterator local_60;
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_48;
  
  local_88.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  basic_variable<std::allocator<char>_>::begin((const_iterator *)&local_48,input);
  basic_variable<std::allocator<char>_>::end(&local_60,input);
  do {
    bVar2 = basic_variable<std::allocator<char>_>::const_iterator::operator!=
                      ((const_iterator *)&local_48,&local_60);
    if (!bVar2) {
      detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
      ::~small_union(&local_60.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current);
      detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
      ::~small_union(&local_48.current);
      (__return_storage_ptr__->super__Vector_base<boost::any,_std::allocator<boost::any>_>)._M_impl.
      super__Vector_impl_data._M_start =
           local_88.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super__Vector_base<boost::any,_std::allocator<boost::any>_>)._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->super__Vector_base<boost::any,_std::allocator<boost::any>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_88.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_88.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<boost::any,_std::allocator<boost::any>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0011fa27:
      std::vector<boost::any,_std::allocator<boost::any>_>::~vector(&local_88);
      return __return_storage_ptr__;
    }
    u = basic_variable<std::allocator<char>_>::
        iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
        ::value(&local_48);
    into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
              ((convert *)&local_68,u,error);
    iVar1 = error->_M_value;
    if (iVar1 == 0) {
      std::vector<boost::any,_std::allocator<boost::any>_>::emplace_back<boost::any>
                (&local_88,(any *)&local_68);
    }
    else {
      (__return_storage_ptr__->super__Vector_base<boost::any,_std::allocator<boost::any>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<boost::any,_std::allocator<boost::any>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<boost::any,_std::allocator<boost::any>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
    if (iVar1 != 0) {
      detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
      ::~small_union(&local_60.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current);
      detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
      ::~small_union(&local_48.current);
      goto LAB_0011fa27;
    }
    basic_variable<std::allocator<char>_>::
    iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::operator++(&local_48);
  } while( true );
}

Assistant:

static std::vector<boost::any> into(const variable_type& input,
                                        std::error_code& error)
    {
        std::vector<boost::any> result;
        for (const auto& entry : input)
        {
            auto value = convert::into<boost::any>(entry, error);
            if (error)
                return {};

            result.push_back(std::move(value));
        }
        return result;
    }